

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

SmallBuffer * __thiscall
helics::BinaryTranslatorOperator::convertToValue
          (BinaryTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  SmallBuffer *in_RDX;
  SmallBuffer *in_RDI;
  SmallBuffer *res;
  SmallBuffer *in_stack_ffffffffffffffd0;
  SmallBuffer *in_stack_ffffffffffffffd8;
  
  SmallBuffer::SmallBuffer(in_RDX);
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x344408);
  SmallBuffer::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

SmallBuffer BinaryTranslatorOperator::convertToValue(std::unique_ptr<Message> message)
{
    SmallBuffer res;
    res = message->data;
    return res;
}